

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::updateFeaturePaths(QMakeEvaluator *this)

{
  QMakeGlobals *pQVar1;
  char cVar2;
  bool bVar3;
  QStringBuilder<ProString,_QString_&> *pQVar4;
  pointer pQVar5;
  QMakeFeatureRoots *this_00;
  long lVar6;
  int i;
  ulong uVar7;
  QString *fb;
  QStringBuilder<ProString,_QString_&> *pQVar8;
  QString *root;
  QString *fileName;
  short sVar9;
  QString *item;
  QStringList *pQVar10;
  QArrayDataPointer<char16_t> *pQVar11;
  long in_FS_OFFSET;
  ProKey local_1d0;
  QDir specdir;
  QLatin1StringView local_188;
  QArrayDataPointer<QString> local_178;
  ProString local_158;
  QArrayDataPointer<QString> local_128;
  QLatin1StringView local_108;
  QArrayDataPointer<QString> local_f8;
  QLatin1StringView local_d8;
  QArrayDataPointer<char16_t> local_c8;
  QLatin1StringView local_a8;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<ProString,_QString_&> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = -0x5555555555555556;
  local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(&local_a8,"/mkspecs");
  QString::QString((QString *)&local_98,local_a8);
  local_c8.size = -0x5555555555555556;
  local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(&local_d8,"/features/");
  QString::QString((QString *)&local_c8,local_d8);
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (QString *)0x0;
  local_f8.size = 0;
  pQVar1 = this->m_option;
  QLatin1String::QLatin1String(&local_108,"QMAKEFEATURES");
  QString::QString(&local_158.m_string,local_108);
  QMakeGlobals::getPathListEnv((QStringList *)&local_78,pQVar1,&local_158.m_string);
  QList<QString>::append((QList<QString> *)&local_f8,(QList<QString> *)&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QList<QString>::append((QList<QString> *)&local_f8,&this->m_qmakefeatures);
  pQVar1 = this->m_option;
  ProKey::ProKey((ProKey *)&local_158,"QMAKEFEATURES");
  QMakeGlobals::propertyValue(&local_78.a,pQVar1,(ProKey *)&local_158);
  ProString::toQString((QString *)&local_128,&local_78.a);
  QMakeGlobals::splitPathList((QStringList *)&local_1d0,pQVar1,(QString *)&local_128);
  QList<QString>::append((QList<QString> *)&local_f8,(QList<QString> *)&local_1d0);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  local_128.size = 0;
  local_128.d = (Data *)0x0;
  local_128.ptr = (QString *)0x0;
  if ((this->m_buildRoot).d.size != 0) {
    local_158.m_string.d.d = (Data *)&this->m_buildRoot;
    local_158.m_string.d.ptr = (char16_t *)&local_98;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<QString_&,_QString_&> *)&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_128,&this->m_buildRoot);
  }
  if ((this->m_sourceRoot).d.size != 0) {
    local_158.m_string.d.d = (Data *)&this->m_sourceRoot;
    local_158.m_string.d.ptr = (char16_t *)&local_98;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<QString_&,_QString_&> *)&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_128,&this->m_sourceRoot);
  }
  local_178.size = -0x5555555555555556;
  local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_178.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = this->m_option;
  QLatin1String::QLatin1String(&local_188,"QMAKEPATH");
  QString::QString((QString *)&local_78,local_188);
  QMakeGlobals::getPathListEnv((QStringList *)&local_178,pQVar1,(QString *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  pQVar10 = (QStringList *)local_178.ptr;
  for (lVar6 = local_178.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
    local_158.m_string.d.d = (Data *)pQVar10;
    local_158.m_string.d.ptr = (char16_t *)&local_98;
    QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    pQVar10 = pQVar10 + 1;
  }
  pQVar10 = (QStringList *)(this->m_qmakepath).d.ptr;
  for (lVar6 = (this->m_qmakepath).d.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
    local_158.m_string.d.d = (Data *)pQVar10;
    local_158.m_string.d.ptr = (char16_t *)&local_98;
    QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    pQVar10 = pQVar10 + 1;
  }
  if ((this->m_qmakespec).d.size != 0) {
    local_158.m_string.d.ptr = (char16_t *)&local_c8;
    local_158.m_string.d.d = (Data *)&this->m_qmakespec;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<QString_&,_QString_&> *)&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_f8,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    _specdir = (Data *)0xaaaaaaaaaaaaaaaa;
    QDir::QDir(&specdir,(QString *)&this->m_qmakespec);
    while( true ) {
      cVar2 = QDir::isRoot();
      if (cVar2 != '\0') break;
      cVar2 = QDir::cdUp();
      if (cVar2 == '\0') break;
      local_78.a.m_string.d.size = -0x5555555555555556;
      local_78.a.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.a.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QDir::path();
      cVar2 = QString::endsWith((QString *)&local_78,(CaseSensitivity)&local_98);
      if (cVar2 != '\0') {
        local_1d0.super_ProString.m_string.d.ptr = (char16_t *)&local_c8;
        local_1d0.super_ProString.m_string.d.d = (Data *)&local_78;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  (&local_158.m_string,(QStringBuilder<const_QString_&,_QString_&> *)&local_1d0);
        bVar3 = QMakeInternal::IoUtils::exists(&local_158.m_string);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
        if (bVar3) {
          QList<QString>::emplaceBack<QString_const&>
                    ((QList<QString> *)&local_128,(QString *)&local_78);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        break;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    }
    QDir::~QDir(&specdir);
  }
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_1d0,"QT_HOST_DATA/get");
  QMakeGlobals::propertyValue(&local_158,pQVar1,&local_1d0);
  ProString::ProString(&local_78.a,&local_158);
  local_78.b = (QString *)&local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>((QString *)&specdir,&local_78);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&specdir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&specdir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d0);
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_1d0,"QT_HOST_DATA/src");
  QMakeGlobals::propertyValue(&local_158,pQVar1,&local_1d0);
  ProString::ProString(&local_78.a,&local_158);
  local_78.b = (QString *)&local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>((QString *)&specdir,&local_78);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&specdir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&specdir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d0);
  pQVar4 = (QStringBuilder<ProString,_QString_&> *)
           (&((ProString *)&(local_128.ptr)->d)->m_string + local_128.size);
  for (pQVar8 = (QStringBuilder<ProString,_QString_&> *)local_128.ptr; pQVar8 != pQVar4;
      pQVar8 = (QStringBuilder<ProString,_QString_&> *)&(pQVar8->a).m_offset) {
    local_158.m_string.d.size = -0x5555555555555556;
    local_158.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_158.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)&local_78,"QMAKE_PLATFORM");
    values((ProStringList *)&local_158,this,(ProKey *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    pQVar11 = (QArrayDataPointer<char16_t> *)local_158.m_string.d.ptr;
    for (lVar6 = local_158.m_string.d.size * 0x30; lVar6 != 0; lVar6 = lVar6 + -0x30) {
      local_78.a.m_string.d.ptr = (char16_t *)&local_c8;
      local_78.a.m_offset._0_1_ = 0x2f;
      local_78.a.m_string.d.d = (Data *)pQVar8;
      local_78.a.m_string.d.size = (qsizetype)pQVar11;
      QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
      ::convertTo<QString>
                ((QString *)&local_1d0,
                 (QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
                  *)&local_78);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_f8,(QString *)&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d0);
      pQVar11 = pQVar11 + 2;
    }
    local_1d0.super_ProString.m_string.d.ptr = (char16_t *)&local_c8;
    local_1d0.super_ProString.m_string.d.d = (Data *)pQVar8;
    QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_1d0);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_f8,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_158);
  }
  sVar9 = 0;
  for (uVar7 = 0; uVar7 < (ulong)local_f8.size; uVar7 = uVar7 + 1) {
    cVar2 = QString::endsWith((QChar)((short)local_f8.ptr + sVar9),0x2f);
    if (cVar2 == '\0') {
      pQVar5 = QList<QString>::data((QList<QString> *)&local_f8);
      QString::append((QChar)((short)pQVar5 + sVar9));
    }
    sVar9 = sVar9 + 0x18;
  }
  QtPrivate::QStringList_removeDuplicates((QList *)&local_f8);
  local_78.a.m_string.d.size = 0;
  local_78.a.m_string.d.d = (Data *)0x0;
  local_78.a.m_string.d.ptr = (char16_t *)0x0;
  fileName = local_f8.ptr;
  for (lVar6 = local_f8.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
    bVar3 = QMakeInternal::IoUtils::exists(fileName);
    if (bVar3) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,fileName);
    }
    fileName = fileName + 1;
  }
  this_00 = (QMakeFeatureRoots *)operator_new(0x28);
  QMakeFeatureRoots::QMakeFeatureRoots(this_00,(QStringList *)&local_78);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset(&this->m_featureRoots,this_00);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_178);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::updateFeaturePaths()
{
    QString mkspecs_concat = QLatin1String("/mkspecs");
    QString features_concat = QLatin1String("/features/");

    QStringList feature_roots;

    feature_roots += m_option->getPathListEnv(QLatin1String("QMAKEFEATURES"));
    feature_roots += m_qmakefeatures;
    feature_roots += m_option->splitPathList(
                m_option->propertyValue(ProKey("QMAKEFEATURES")).toQString());

    QStringList feature_bases;
    if (!m_buildRoot.isEmpty()) {
        feature_bases << m_buildRoot + mkspecs_concat;
        feature_bases << m_buildRoot;
    }
    if (!m_sourceRoot.isEmpty()) {
        feature_bases << m_sourceRoot + mkspecs_concat;
        feature_bases << m_sourceRoot;
    }

    const auto items = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &item : items)
        feature_bases << (item + mkspecs_concat);

    for (const QString &item : std::as_const(m_qmakepath))
        feature_bases << (item + mkspecs_concat);

    if (!m_qmakespec.isEmpty()) {
        // The spec is already platform-dependent, so no subdirs here.
        feature_roots << (m_qmakespec + features_concat);

        // Also check directly under the root directory of the mkspecs collection
        QDir specdir(m_qmakespec);
        while (!specdir.isRoot() && specdir.cdUp()) {
            const QString specpath = specdir.path();
            if (specpath.endsWith(mkspecs_concat)) {
                if (IoUtils::exists(specpath + features_concat))
                    feature_bases << specpath;
                break;
            }
        }
    }

    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + mkspecs_concat);
    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + mkspecs_concat);

    for (const QString &fb : std::as_const(feature_bases)) {
        const auto sfxs = values(ProKey("QMAKE_PLATFORM"));
        for (const ProString &sfx : sfxs)
            feature_roots << (fb + features_concat + sfx + QLatin1Char('/'));
        feature_roots << (fb + features_concat);
    }

    for (int i = 0; i < feature_roots.size(); ++i)
        if (!feature_roots.at(i).endsWith(QLatin1Char('/')))
            feature_roots[i].append(QLatin1Char('/'));

    feature_roots.removeDuplicates();

    QStringList ret;
    for (const QString &root : std::as_const(feature_roots))
        if (IoUtils::exists(root))
            ret << root;
    m_featureRoots = new QMakeFeatureRoots(ret);
}